

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameData.cpp
# Opt level: O3

bool __thiscall GameData::IsGameOver(GameData *this)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  ofstream TempFile;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  bVar8 = false;
  uVar3 = 0;
  do {
    uVar4 = uVar3 + 1;
    uVar5 = 1;
    do {
      uVar6 = uVar5 - 1;
      iVar2 = this->num[uVar3][uVar6];
      if (iVar2 == 0) {
        return bVar8;
      }
      if (uVar3 == 0) {
LAB_00103100:
        if (this->num[uVar3 + 1][uVar6] == iVar2) {
          return bVar8;
        }
      }
      else {
        if (this->num[uVar3 - 1][uVar6] == iVar2) {
          return bVar8;
        }
        if (uVar3 != 3) goto LAB_00103100;
      }
      if (uVar5 != 1) {
        if (this->num[uVar3][uVar5 - 2] == iVar2) {
          return bVar8;
        }
        if (uVar5 == 4) break;
      }
      if (this->num[uVar3][uVar5] == iVar2) {
        return bVar8;
      }
      bVar7 = uVar5 < 4;
      uVar5 = uVar5 + 1;
    } while (bVar7);
    bVar8 = 2 < uVar3;
    uVar3 = uVar4;
    if (uVar4 == 4) {
      iVar2 = this->score;
      if (this->score < this->my_best) {
        iVar2 = this->my_best;
      }
      this->my_best = iVar2;
      std::ofstream::ofstream(&local_210,"2048GAME.data",_S_out|_S_bin);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_bf5e,0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
      else {
        std::ostream::operator<<((ostream *)&local_210,this->my_best);
      }
      std::ofstream::close();
      local_210 = _VTT;
      *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
      std::filebuf::~filebuf(local_208);
      std::ios_base::~ios_base(local_118);
      return true;
    }
  } while( true );
}

Assistant:

bool GameData::IsGameOver() {
    for (int i = 0; i < 4; i++) {
        for (int j = 0; j < 4; j++) {
            if (num[i][j] == 0)return false;
            if (i - 1 >= 0 && num[i - 1][j] == num[i][j])return false;
            if (i + 1 < 4 && num[i + 1][j] == num[i][j])return false;
            if (j - 1 >= 0 && num[i][j - 1] == num[i][j])return false;
            if (j + 1 < 4 && num[i][j + 1] == num[i][j])return false;
        }
    }
    my_best = std::max(my_best, score);
    std::ofstream TempFile("2048GAME.data",std::ios::out | std::ios::binary);
    if(TempFile.is_open())
        TempFile<<my_best;
    else
        std::cout<<"存储最佳分数失败！"<<std::endl;
    TempFile.close();
    return true;
}